

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void bitset_set_lenrange(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint32_t i;
  uint64_t temp;
  uint32_t endword;
  uint32_t firstword;
  uint32_t lenminusone_local;
  uint32_t start_local;
  uint64_t *words_local;
  
  uVar3 = start >> 6;
  uVar4 = start + lenminusone >> 6;
  bVar2 = (byte)start;
  if (uVar3 == uVar4) {
    words[uVar3] = (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) << (bVar2 & 0x3f) |
                   words[uVar3];
  }
  else {
    uVar1 = words[uVar4];
    words[uVar3] = -1L << (bVar2 & 0x3f) | words[uVar3];
    for (i = uVar3 + 1; i < uVar4; i = i + 2) {
      words[i + 1] = 0xffffffffffffffff;
      words[i] = 0xffffffffffffffff;
    }
    words[uVar4] = uVar1 | 0xffffffffffffffffU >> ((bVar2 ^ 0xff) - (char)lenminusone & 0x3f);
  }
  return;
}

Assistant:

static inline void bitset_set_lenrange(uint64_t *words, uint32_t start,
                                       uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        words[firstword] |= ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
                            << (start % 64);
        return;
    }
    uint64_t temp = words[endword];
    words[firstword] |= (~UINT64_C(0)) << (start % 64);
    for (uint32_t i = firstword + 1; i < endword; i += 2)
        words[i] = words[i + 1] = ~UINT64_C(0);
    words[endword] =
        temp | (~UINT64_C(0)) >> (((~start + 1) - lenminusone - 1) % 64);
}